

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobal(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  GlobalType local_38;
  undefined1 local_29;
  Location *pLStack_28;
  bool mutable__local;
  Location *loc_local;
  SharedValidator *this_local;
  Type type_local;
  
  local_29 = mutable_;
  pLStack_28 = loc;
  loc_local = (Location *)this;
  unique0x1000007c = type;
  GlobalType::GlobalType(&local_38,type,mutable_);
  std::vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
  ::push_back(&this->globals_,&local_38);
  Result::Result((Result *)&type_local,Ok);
  return (Result)type_local.enum_;
}

Assistant:

Result SharedValidator::OnGlobal(const Location& loc,
                                 Type type,
                                 bool mutable_) {
  globals_.push_back(GlobalType{type, mutable_});
  return Result::Ok;
}